

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O2

void __thiscall
QProcessPrivate::setError(QProcessPrivate *this,ProcessError error,QString *description)

{
  qsizetype qVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  char *s;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this->processError = (quint8)error;
  if ((description->d).size != 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      QString::operator=(&(this->super_QIODevicePrivate).errorString,description);
      return;
    }
    goto LAB_003cc280;
  }
  switch(error) {
  case FailedToStart:
    s = "Process failed to start";
    break;
  case Crashed:
    s = "Process crashed";
    break;
  case Timedout:
    s = "Process operation timed out";
    break;
  case ReadError:
    s = "Error reading from process";
    break;
  case WriteError:
    s = "Error writing to process";
    break;
  case UnknownError:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      QString::clear(&(this->super_QIODevicePrivate).errorString);
      return;
    }
    goto LAB_003cc280;
  default:
    goto switchD_003cc1d0_default;
  }
  QProcess::tr((QString *)&local_38,s,(char *)0x0,-1);
  pDVar2 = (this->super_QIODevicePrivate).errorString.d.d;
  pcVar3 = (this->super_QIODevicePrivate).errorString.d.ptr;
  (this->super_QIODevicePrivate).errorString.d.d = local_38.d;
  (this->super_QIODevicePrivate).errorString.d.ptr = local_38.ptr;
  qVar1 = (this->super_QIODevicePrivate).errorString.d.size;
  (this->super_QIODevicePrivate).errorString.d.size = local_38.size;
  local_38.d = pDVar2;
  local_38.ptr = pcVar3;
  local_38.size = qVar1;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
switchD_003cc1d0_default:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
LAB_003cc280:
  __stack_chk_fail();
}

Assistant:

void QProcessPrivate::setError(QProcess::ProcessError error, const QString &description)
{
    processError = error;
    if (description.isEmpty()) {
        switch (error) {
        case QProcess::FailedToStart:
            errorString = QProcess::tr("Process failed to start");
            break;
        case QProcess::Crashed:
            errorString = QProcess::tr("Process crashed");
            break;
        case QProcess::Timedout:
            errorString = QProcess::tr("Process operation timed out");
            break;
        case QProcess::ReadError:
            errorString = QProcess::tr("Error reading from process");
            break;
        case QProcess::WriteError:
            errorString = QProcess::tr("Error writing to process");
            break;
        case QProcess::UnknownError:
            errorString.clear();
            break;
        }
    } else {
        errorString = description;
    }
}